

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O0

void math::internal::matrix_svd_clear_super_entry<double>
               (int rows,int cols,double *mat_b,double *mat_q,int row_index,double *epsilon)

{
  int iVar1;
  double dVar2;
  double local_50;
  double givens_s;
  double givens_c;
  double norm;
  double *pdStack_30;
  int i;
  double *epsilon_local;
  double *pdStack_20;
  int row_index_local;
  double *mat_q_local;
  double *mat_b_local;
  int cols_local;
  int rows_local;
  
  norm._4_4_ = row_index + 1;
  pdStack_30 = epsilon;
  epsilon_local._4_4_ = row_index;
  pdStack_20 = mat_q;
  mat_q_local = mat_b;
  mat_b_local._0_4_ = cols;
  mat_b_local._4_4_ = rows;
  while( true ) {
    if ((int)mat_b_local <= norm._4_4_) {
      return;
    }
    if ((0.0 - *pdStack_30 <= mat_q_local[epsilon_local._4_4_ * (int)mat_b_local + norm._4_4_]) &&
       (mat_q_local[epsilon_local._4_4_ * (int)mat_b_local + norm._4_4_] <= *pdStack_30 + 0.0))
    break;
    givens_c = mat_q_local[epsilon_local._4_4_ * (int)mat_b_local + norm._4_4_] *
               mat_q_local[epsilon_local._4_4_ * (int)mat_b_local + norm._4_4_] +
               mat_q_local[norm._4_4_ * (int)mat_b_local + norm._4_4_] *
               mat_q_local[norm._4_4_ * (int)mat_b_local + norm._4_4_];
    dVar2 = sqrt(givens_c);
    iVar1 = 1;
    if (mat_q_local[norm._4_4_ * (int)mat_b_local + norm._4_4_] < 0.0) {
      iVar1 = -1;
    }
    givens_c = dVar2 * (double)iVar1;
    givens_s = mat_q_local[norm._4_4_ * (int)mat_b_local + norm._4_4_] / givens_c;
    local_50 = mat_q_local[epsilon_local._4_4_ * (int)mat_b_local + norm._4_4_] / givens_c;
    matrix_apply_givens_row<double>
              (mat_q_local,(int)mat_b_local,(int)mat_b_local,epsilon_local._4_4_,norm._4_4_,
               &givens_s,&local_50);
    matrix_apply_givens_column<double>
              (pdStack_20,mat_b_local._4_4_,(int)mat_b_local,epsilon_local._4_4_,norm._4_4_,
               &givens_s,&local_50);
    norm._4_4_ = norm._4_4_ + 1;
  }
  mat_q_local[epsilon_local._4_4_ * (int)mat_b_local + norm._4_4_] = 0.0;
  return;
}

Assistant:

void
matrix_svd_clear_super_entry(int rows, int cols, T* mat_b, T* mat_q,
    int row_index, T const& epsilon)
{
    for (int i = row_index + 1; i < cols; ++i)
    {
        if (MATH_EPSILON_EQ(mat_b[row_index * cols + i], T(0), epsilon))
        {
            mat_b[row_index * cols + i] = T(0);
            break;
        }

        T norm = MATH_POW2(mat_b[row_index * cols + i])
            + MATH_POW2(mat_b[i * cols + i]);
        norm = std::sqrt(norm) * MATH_SIGN(mat_b[i * cols + i]);

        T givens_c = mat_b[i * cols + i] / norm;
        T givens_s = mat_b[row_index * cols + i] / norm;
        matrix_apply_givens_row(mat_b, cols, cols, row_index,
            i, givens_c, givens_s);
        matrix_apply_givens_column(mat_q, rows, cols, row_index,
            i, givens_c, givens_s);
    }
}